

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_NetworkIdentifyWithoutDomain_Test::TestBody
          (InterpreterTestSuite_PC_NetworkIdentifyWithoutDomain_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar4;
  value_t vVar5;
  json_value jVar6;
  _Alloc_hider _Var7;
  Registry *pRVar8;
  Status SVar9;
  bool bVar10;
  reference this_00;
  char *pcVar11;
  char *pcVar12;
  Status local_51a;
  Status local_519;
  AssertionResult gtest_ar_;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined1 local_4f0 [8];
  _Alloc_hider local_4e8;
  long local_4e0;
  char local_4d8 [16];
  _Alloc_hider local_4c8;
  char local_4b8 [16];
  string local_4a8;
  Json json;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  internal local_468 [8];
  undefined8 *local_460;
  string local_458;
  ByteArray local_438;
  Value value;
  string local_3d0;
  State local_3b0;
  State local_3ac;
  Network nwk;
  ByteArray local_348;
  char *local_330;
  UnixTime local_328;
  UnixTime local_320;
  undefined1 local_318 [8];
  json_value local_310;
  _Any_data local_308;
  code *local_2f8;
  undefined8 uStack_2f0;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  nwk.mId.mId = 0;
  nwk.mDomainId.mId = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&nwk);
  if ((char)br._vptr_BorderRouter == '\0') {
    testing::Message::Message((Message *)&nwk);
    if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x649,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
    local_460 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    if (local_460 == (undefined8 *)0x0) goto LAB_0017a35a;
    if ((undefined8 *)*local_460 != local_460 + 2) {
      operator_delete((undefined8 *)*local_460);
    }
  }
  else {
    puVar3 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    pRVar8 = ctx.mRegistry;
    nwk._0_8_ = &nwk.mName._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&nwk,"127.0.0.1","");
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value.mError._0_8_ = &value.mError.mMessage._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_3ac,0,0,0,0,0);
    local_4f0 = (undefined1  [8])&local_4e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"net1","");
    gtest_ar_._0_8_ = &local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_,"");
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
    json._0_8_ = &local_478;
    std::__cxx11::string::_M_construct<char_const*>((string *)&json,"");
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"domain1","");
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    pcVar11 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"","");
    ot::commissioner::UnixTime::UnixTime(&local_320,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&nwk,0x4e21,&local_438,(string *)&value,local_3ac,
               (string *)local_4f0,1,(string *)&gtest_ar_,&local_458,(Timestamp)0x0,0,
               (string *)&json,&local_348,&local_4a8,'\0',0,&local_3d0,local_320,0x103f);
    local_519 = ot::commissioner::persistent_storage::Registry::Add(pRVar8,(BorderAgent *)&br);
    local_51a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_468,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_519,&local_51a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p);
    }
    if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)json._0_8_ != &local_478) {
      operator_delete((void *)json._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar_._0_8_ != &local_508) {
      operator_delete((void *)gtest_ar_._0_8_);
    }
    if (local_4f0 != (undefined1  [8])&local_4e0) {
      operator_delete((void *)local_4f0);
    }
    if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
      operator_delete((void *)value.mError._0_8_);
    }
    if (local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    puVar3 = local_460;
    if (local_468[0] == (internal)0x0) {
      testing::Message::Message((Message *)&br);
      if (local_460 != (undefined8 *)0x0) {
        pcVar11 = (char *)*local_460;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x64d,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if (br._vptr_BorderRouter != (_func_int **)0x0) {
        (**(code **)(*br._vptr_BorderRouter + 8))();
      }
      if (local_460 == (undefined8 *)0x0) goto LAB_0017a35a;
      if ((undefined8 *)*local_460 != local_460 + 2) {
        operator_delete((undefined8 *)*local_460);
      }
    }
    else {
      if (local_460 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_460 != local_460 + 2) {
          operator_delete((undefined8 *)*local_460);
        }
        operator_delete(puVar3);
      }
      pRVar8 = ctx.mRegistry;
      nwk._0_8_ = &nwk.mName._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&nwk,"127.0.0.2","");
      local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      value.mError._0_8_ = &value.mError.mMessage._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_3b0,0,0,0,0,0);
      local_4f0 = (undefined1  [8])&local_4e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"net2","");
      gtest_ar_._0_8_ = &local_508;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_,"");
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
      json._0_8_ = &local_478;
      std::__cxx11::string::_M_construct<char_const*>((string *)&json,"");
      local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      local_330 = "";
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0);
      ot::commissioner::UnixTime::UnixTime(&local_328,0);
      pcVar11 = (char *)(ulong)(uint)local_3b0;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&nwk,0x4e22,&local_438,(string *)&value,local_3b0,
                 (string *)local_4f0,2,(string *)&gtest_ar_,&local_458,(Timestamp)0x0,0,
                 (string *)&json,&local_348,&local_4a8,'\0',0,&local_3d0,local_328,0x3f);
      local_519 = ot::commissioner::persistent_storage::Registry::Add(pRVar8,(BorderAgent *)&br);
      local_51a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (local_468,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x3F})"
                 ,"RegistryStatus::kSuccess",&local_519,&local_51a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p);
      }
      if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)json._0_8_ != &local_478) {
        operator_delete((void *)json._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar_._0_8_ != &local_508) {
        operator_delete((void *)gtest_ar_._0_8_);
      }
      if (local_4f0 != (undefined1  [8])&local_4e0) {
        operator_delete((void *)local_4f0);
      }
      if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
        operator_delete((void *)value.mError._0_8_);
      }
      if (local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
        operator_delete((void *)nwk._0_8_);
      }
      if (local_468[0] != (internal)0x0) {
        if (local_460 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_460 != local_460 + 2) {
            operator_delete((undefined8 *)*local_460);
          }
          operator_delete(local_460);
        }
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
        ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk.mId,1);
        br.mNetworkId = nwk.mId;
        SVar9 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br)
        ;
        value.mError.mCode._0_1_ = SVar9;
        local_4f0 = (undefined1  [8])((ulong)local_4f0 & 0xffffffffffffff00);
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwk,"ctx.mRegistry->SetCurrentNetwork(br)",
                   "RegistryStatus::kSuccess",(Status *)&value,local_4f0);
        _Var7 = nwk.mName._M_dataplus;
        if ((char)nwk.mId.mId == '\0') {
          testing::Message::Message((Message *)&value);
          if (nwk.mName._M_dataplus._M_p == (pointer)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)nwk.mName._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_4f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x654,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_4f0,(Message *)&value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f0);
          if (value.mError._0_8_ != 0) {
            (**(code **)(*(long *)value.mError._0_8_ + 8))();
          }
          if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
            if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
              operator_delete(*nwk.mName._M_dataplus._M_p);
            }
            goto LAB_0017abbd;
          }
        }
        else {
          if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
            if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
              operator_delete(*nwk.mName._M_dataplus._M_p);
            }
            operator_delete(_Var7._M_p);
          }
          ot::commissioner::persistent_storage::Network::Network(&nwk);
          SVar9 = ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                            (ctx.mRegistry,&nwk);
          local_4f0[0] = SVar9;
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",local_4f0,&gtest_ar_.success_);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_4f0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar12 = "";
            }
            else {
              pcVar12 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x657,pcVar12);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)local_4f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if (local_4f0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_4f0 + 8))();
            }
          }
          _Var7._M_p = value.mError.mMessage._M_dataplus._M_p;
          if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
            if (*value.mError.mMessage._M_dataplus._M_p !=
                value.mError.mMessage._M_dataplus._M_p + 0x10) {
              operator_delete(*value.mError.mMessage._M_dataplus._M_p);
            }
            operator_delete(_Var7._M_p);
          }
          local_4f0._0_4_ = 1;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&value,"nwk.mId.mId","1",(uint *)&nwk,(int *)local_4f0);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_4f0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar12 = "";
            }
            else {
              pcVar12 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x658,pcVar12);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)local_4f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if (local_4f0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_4f0 + 8))();
            }
          }
          if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
            if (*value.mError.mMessage._M_dataplus._M_p !=
                value.mError.mMessage._M_dataplus._M_p + 0x10) {
              operator_delete(*value.mError.mMessage._M_dataplus._M_p);
            }
            operator_delete(value.mError.mMessage._M_dataplus._M_p);
          }
          local_458.field_2._M_allocated_capacity = 0;
          local_458._M_dataplus._M_p = (pointer)0x0;
          local_458._M_string_length = 0;
          paVar1 = &value.mError.mMessage.field_2;
          value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          paVar2 = &value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          local_4f0 = (undefined1  [8])&local_4e0;
          value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
          value.mData._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"Network identify","")
          ;
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&json,&ctx.mInterpreter,(string *)local_4f0);
          local_508._M_allocated_capacity = local_458.field_2._M_allocated_capacity;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )local_458._M_string_length;
          gtest_ar_._0_8_ = local_458._M_dataplus._M_p;
          local_458.field_2._M_allocated_capacity = local_478._M_allocated_capacity;
          local_458._M_dataplus._M_p = (pointer)json._0_8_;
          local_458._M_string_length = (size_type)json.m_value;
          json.m_type = null;
          json._1_7_ = 0;
          json.m_value.object = (object_t *)0x0;
          local_478._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&json);
          if (local_4f0 != (undefined1  [8])&local_4e0) {
            operator_delete((void *)local_4f0);
          }
          ot::commissioner::Interpreter::Eval
                    ((Value *)local_4f0,&ctx.mInterpreter,(Expression *)&local_458);
          value.mError.mCode = local_4f0._0_4_;
          std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_4e8);
          std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_4c8);
          if (local_4c8._M_p != local_4b8) {
            operator_delete(local_4c8._M_p);
          }
          if (local_4e8._M_p != local_4d8) {
            operator_delete(local_4e8._M_p);
          }
          bVar10 = ot::commissioner::Interpreter::Value::HasNoError(&value);
          gtest_ar_.success_ = bVar10;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!bVar10) {
            testing::Message::Message((Message *)&json);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_4f0,(internal *)&gtest_ar_,(AssertionResult *)0x2ddeee,
                       "false","true",pcVar11);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x65f,(char *)local_4f0);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_4a8,(Message *)&json);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4a8);
            if (local_4f0 != (undefined1  [8])&local_4e0) {
              operator_delete((void *)local_4f0);
            }
            if (json._0_8_ != 0) {
              (**(code **)(*(long *)json._0_8_ + 8))();
            }
            uVar4._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              if (*(void **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl !=
                  (void *)((long)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 0x10)) {
                operator_delete(*(void **)gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
              }
              operator_delete((void *)uVar4._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
            }
          }
          json._0_8_ = json._0_8_ & 0xffffffffffffff00;
          json.m_value.object = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(&json);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(&json);
          ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)local_4f0,&value);
          nlohmann::detail::input_adapter::
          input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                    ((input_adapter *)&gtest_ar_,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_4f0,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_4e8._M_p + (long)local_4f0));
          local_2f8 = (code *)0x0;
          uStack_2f0 = 0;
          local_308._M_unused._M_object = (void *)0x0;
          local_308._8_8_ = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_318,(input_adapter *)&gtest_ar_,(parser_callback_t *)&local_308,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_318);
          jVar6 = json.m_value;
          vVar5 = json.m_type;
          json.m_type = local_318[0];
          local_318[0] = vVar5;
          json.m_value = local_310;
          local_310 = jVar6;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(&json);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_318 + 8),local_318[0]);
          if (local_2f8 != (code *)0x0) {
            (*local_2f8)(&local_308,&local_308,__destroy_functor);
          }
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
          }
          if (local_4f0 != (undefined1  [8])&local_4e0) {
            operator_delete((void *)local_4f0);
          }
          bVar10 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
          gtest_ar_.success_ = bVar10;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!bVar10) {
            testing::Message::Message((Message *)&local_4a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_4f0,(internal *)&gtest_ar_,
                       (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true",
                       pcVar11);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_3d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x669,(char *)local_4f0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_3d0,(Message *)&local_4a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
            if (local_4f0 != (undefined1  [8])&local_4e0) {
              operator_delete((void *)local_4f0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_4a8._M_dataplus._M_p + 8))();
            }
            uVar4._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              if (*(void **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl !=
                  (void *)((long)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 0x10)) {
                operator_delete(*(void **)gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
              }
              operator_delete((void *)uVar4._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
            }
          }
          gtest_ar_._0_8_ = &local_508;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&gtest_ar_,"0x0000000000000002","");
          this_00 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::at(&json,(key_type *)&gtest_ar_);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0,
                     this_00);
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_4a8,"\"net2\"",
                     "json.at(\"0x0000000000000002\").get<std::string>().c_str()","net2",
                     (char *)local_4f0);
          if (local_4f0 != (undefined1  [8])&local_4e0) {
            operator_delete((void *)local_4f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)gtest_ar_._0_8_ != &local_508) {
            operator_delete((void *)gtest_ar_._0_8_);
          }
          if ((char)local_4a8._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)local_4f0);
            if ((undefined8 *)local_4a8._M_string_length == (undefined8 *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)local_4a8._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x66a,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)local_4f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if (local_4f0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_4f0 + 8))();
            }
          }
          if ((undefined8 *)local_4a8._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_4a8._M_string_length !=
                (undefined8 *)(local_4a8._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_4a8._M_string_length);
            }
            operator_delete((void *)local_4a8._M_string_length);
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(&json);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&json.m_value.boolean,json.m_type);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mData._M_dataplus._M_p != paVar2) {
            operator_delete(value.mData._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
            operator_delete(value.mError.mMessage._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
            operator_delete(nwk.mMlp._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
LAB_0017abbd:
            operator_delete(nwk.mName._M_dataplus._M_p);
          }
        }
        br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00395f58;
        ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
        goto LAB_0017a35a;
      }
      testing::Message::Message((Message *)&br);
      if (local_460 != (undefined8 *)0x0) {
        local_330 = (char *)*local_460;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x651,local_330);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if (br._vptr_BorderRouter != (_func_int **)0x0) {
        (**(code **)(*br._vptr_BorderRouter + 8))();
      }
      if (local_460 == (undefined8 *)0x0) goto LAB_0017a35a;
      if ((undefined8 *)*local_460 != local_460 + 2) {
        operator_delete((undefined8 *)*local_460);
      }
    }
  }
  operator_delete(local_460);
LAB_0017a35a:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkIdentifyWithoutDomain)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0,
                                             0x3F}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 1;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, 1);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network identify");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    Json json;
    try
    {
        json = Json::parse(value.ToString());
    } catch (Json::parse_error &e)
    {
        EXPECT_TRUE(false) << "Failed to parse value: " << e.what();
    }
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_STREQ("net2", json.at("0x0000000000000002").get<std::string>().c_str());
}